

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::GenerateCompleteStFld
          (Lowerer *this,Instr *instr,bool emitFastPath,JnHelperMethod monoHelperAfterFastPath,
          JnHelperMethod polyHelperAfterFastPath,JnHelperMethod monoHelperWithoutFastPath,
          JnHelperMethod polyHelperWithoutFastPath,bool withPutFlags,PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind e0;
  BailOutKind e1;
  undefined4 *puVar3;
  RegOpnd *local_68;
  RegOpnd *typeOpnd;
  LabelInstr *pLStack_58;
  bool isHelper;
  LabelInstr *labelHelper;
  LabelInstr *labelBailOut;
  Instr *prevInstr;
  BailOutKind kindMinusBits;
  JnHelperMethod JStack_34;
  bool withPutFlags_local;
  JnHelperMethod monoHelperWithoutFastPath_local;
  JnHelperMethod polyHelperAfterFastPath_local;
  JnHelperMethod monoHelperAfterFastPath_local;
  bool emitFastPath_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  prevInstr._7_1_ = withPutFlags;
  kindMinusBits = monoHelperWithoutFastPath;
  JStack_34 = polyHelperAfterFastPath;
  monoHelperWithoutFastPath_local = monoHelperAfterFastPath;
  polyHelperAfterFastPath_local._3_1_ = emitFastPath;
  _monoHelperAfterFastPath_local = instr;
  instr_local = (Instr *)this;
  bVar2 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0);
  if ((bVar2) && (bVar2 = IR::Instr::HasBailOutInfo(_monoHelperAfterFastPath_local), bVar2)) {
    e0 = IR::Instr::GetBailOutKind(_monoHelperAfterFastPath_local);
    e1 = IR::operator~(BailOutKindBits);
    prevInstr._0_4_ = IR::operator&(e0,e1);
    if (((BailOutKind)prevInstr == BailOutOnImplicitCalls) ||
       ((BailOutKind)prevInstr == BailOutOnImplicitCallsPreOp)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1c75,
                         "(kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp)"
                         ,
                         "kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  labelBailOut = (LabelInstr *)_monoHelperAfterFastPath_local->m_prev;
  labelHelper = (LabelInstr *)0x0;
  pLStack_58 = (LabelInstr *)0x0;
  typeOpnd._7_1_ = 0;
  local_68 = (RegOpnd *)0x0;
  if (((polyHelperAfterFastPath_local._3_1_ & 1) == HelperInvalid >> 0x18) ||
     (bVar2 = GenerateFastStFldForCustomProperty
                        (this,_monoHelperAfterFastPath_local,&stack0xffffffffffffffa8), !bVar2)) {
    bVar2 = GenerateStFldWithCachedType
                      (this,_monoHelperAfterFastPath_local,(bool *)((long)&typeOpnd + 7),
                       &stack0xffffffffffffffa8,&local_68);
    if (bVar2) {
      if (pLStack_58 != (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1c8e,"(labelHelper == nullptr)","labelHelper == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      return &labelBailOut->super_Instr;
    }
    if ((polyHelperAfterFastPath_local._3_1_ & 1) == HelperInvalid >> 0x18) {
      if (pLStack_58 != (LabelInstr *)0x0) {
        pLStack_58->field_0x78 = pLStack_58->field_0x78 & 0xfd | (typeOpnd._7_1_ & 1) << 1;
        IR::Instr::InsertBefore(_monoHelperAfterFastPath_local,&pLStack_58->super_Instr);
      }
      labelBailOut = (LabelInstr *)
                     LowerStFld(this,_monoHelperAfterFastPath_local,kindMinusBits,kindMinusBits,true
                                ,labelHelper,(bool)(typeOpnd._7_1_ & 1),(bool)(prevInstr._7_1_ & 1),
                                flags);
    }
    else {
      bVar2 = GenerateFastStFld(this,_monoHelperAfterFastPath_local,kindMinusBits,
                                polyHelperWithoutFastPath,&labelHelper,local_68,
                                (bool *)((long)&typeOpnd + 7),&stack0xffffffffffffffa8,
                                (bool)(prevInstr._7_1_ & 1),flags);
      if (!bVar2) {
        if (pLStack_58 != (LabelInstr *)0x0) {
          pLStack_58->field_0x78 = pLStack_58->field_0x78 & 0xfd | (typeOpnd._7_1_ & 1) << 1;
          IR::Instr::InsertBefore(_monoHelperAfterFastPath_local,&pLStack_58->super_Instr);
        }
        labelBailOut = (LabelInstr *)
                       LowerStFld(this,_monoHelperAfterFastPath_local,
                                  monoHelperWithoutFastPath_local,JStack_34,true,labelHelper,
                                  (bool)(typeOpnd._7_1_ & 1),(bool)(prevInstr._7_1_ & 1),flags);
      }
    }
  }
  else {
    if (pLStack_58 == (LabelInstr *)0x0) {
      IR::Instr::Remove(_monoHelperAfterFastPath_local);
      return &labelBailOut->super_Instr;
    }
    if (((byte)pLStack_58->field_0x78 >> 1 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1c82,"(labelHelper->isOpHelper)","labelHelper->isOpHelper");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    IR::Instr::InsertBefore(_monoHelperAfterFastPath_local,&pLStack_58->super_Instr);
    labelBailOut = (LabelInstr *)
                   LowerStFld(this,_monoHelperAfterFastPath_local,kindMinusBits,
                              polyHelperWithoutFastPath,true,labelHelper,(bool)(typeOpnd._7_1_ & 1),
                              (bool)(prevInstr._7_1_ & 1),flags);
  }
  return &labelBailOut->super_Instr;
}

Assistant:

IR::Instr* Lowerer::GenerateCompleteStFld(IR::Instr* instr, bool emitFastPath, IR::JnHelperMethod monoHelperAfterFastPath, IR::JnHelperMethod polyHelperAfterFastPath,
    IR::JnHelperMethod monoHelperWithoutFastPath, IR::JnHelperMethod polyHelperWithoutFastPath, bool withPutFlags, Js::PropertyOperationFlags flags)
{
    if(instr->CallsAccessor() && instr->HasBailOutInfo())
    {
        IR::BailOutKind kindMinusBits = instr->GetBailOutKind() & ~IR::BailOutKindBits;
        Assert(kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp);
    }

    IR::Instr* prevInstr = instr->m_prev;

    IR::LabelInstr* labelBailOut = nullptr;
    IR::LabelInstr* labelHelper = nullptr;
    bool isHelper = false;
    IR::RegOpnd* typeOpnd = nullptr;
    if(emitFastPath && GenerateFastStFldForCustomProperty(instr, &labelHelper))
    {
        if(labelHelper)
        {
            Assert(labelHelper->isOpHelper);
            instr->InsertBefore(labelHelper);
            prevInstr = this->LowerStFld(instr, monoHelperWithoutFastPath, polyHelperWithoutFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
        }
        else
        {
            instr->Remove();
            return prevInstr;
        }
    }
    else if (this->GenerateStFldWithCachedType(instr, &isHelper, &labelHelper, &typeOpnd))
    {
        Assert(labelHelper == nullptr);
        return prevInstr;
    }
    else if (emitFastPath)
    {
        if (!GenerateFastStFld(instr, monoHelperWithoutFastPath, polyHelperWithoutFastPath, &labelBailOut, typeOpnd, &isHelper, &labelHelper, withPutFlags, flags))
        {
            if (labelHelper != nullptr)
            {
                labelHelper->isOpHelper = isHelper;
                instr->InsertBefore(labelHelper);
            }
            prevInstr = this->LowerStFld(instr, monoHelperAfterFastPath, polyHelperAfterFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
        }
    }
    else
    {
        if (labelHelper != nullptr)
        {
            labelHelper->isOpHelper = isHelper;
            instr->InsertBefore(labelHelper);
        }
        prevInstr = this->LowerStFld(instr, monoHelperWithoutFastPath, monoHelperWithoutFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
    }

    return prevInstr;
}